

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O2

void * __thiscall
ft::
vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::realloc(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *this,void *__ptr,size_t __size)

{
  pointer pbVar1;
  void *extraout_RAX;
  size_type sVar2;
  long lVar3;
  size_type i;
  ulong uVar4;
  
  sVar2 = (long)__ptr + (ulong)(__ptr == (void *)0x0);
  pbVar1 = (pointer)operator_new(sVar2 * 0x20);
  lVar3 = 0;
  for (uVar4 = 0; uVar4 < this->m_size; uVar4 = uVar4 + 1) {
    std::__cxx11::string::string
              ((string *)((long)&(pbVar1->_M_dataplus)._M_p + lVar3),
               (string *)((long)&(this->m_data->_M_dataplus)._M_p + lVar3));
    std::__cxx11::string::~string((string *)((long)&(this->m_data->_M_dataplus)._M_p + lVar3));
    lVar3 = lVar3 + 0x20;
  }
  operator_delete(this->m_data);
  this->m_data = pbVar1;
  this->m_capacity = sVar2;
  return extraout_RAX;
}

Assistant:

void	realloc(size_type newCapacity) {
		if (newCapacity == 0)
			newCapacity = 1;
		pointer	newBlock = this->get_allocator().allocate(newCapacity);
		for (size_type i = 0; i < this->size(); ++i)
		{
			this->get_allocator().construct(newBlock + i, this->m_data[i]);
			this->get_allocator().destroy(this->m_data + i);
		}
		this->get_allocator().deallocate(this->m_data, this->capacity());
		this->m_data = newBlock;
		this->m_capacity = newCapacity;
	}